

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O1

void __thiscall DIS::FirePdu::unmarshal(FirePdu *this,DataStream *dataStream)

{
  WarfareFamilyPdu::unmarshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_munitionExpendibleID,dataStream);
  EventIdentifier::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_fireMissionIndex);
  Vector3Double::unmarshal(&this->_locationInWorldCoordinates,dataStream);
  MunitionDescriptor::unmarshal(&this->_descriptor,dataStream);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  DataStream::operator>>(dataStream,&this->_range);
  return;
}

Assistant:

void FirePdu::unmarshal(DataStream& dataStream)
{
    WarfareFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _munitionExpendibleID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _fireMissionIndex;
    _locationInWorldCoordinates.unmarshal(dataStream);
    _descriptor.unmarshal(dataStream);
    _velocity.unmarshal(dataStream);
    dataStream >> _range;
}